

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator.hpp
# Opt level: O2

void __thiscall calculator::error::error(error *this,string *expr,string *message)

{
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)message);
  *(undefined ***)this = &PTR__error_0017c758;
  std::__cxx11::string::string((string *)&this->expr_,(string *)expr);
  return;
}

Assistant:

error(const std::string& expr, const std::string& message)
    : std::runtime_error(message),
      expr_(expr)
  { }